

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O0

Expression *
slang::ast::RangeSelectExpression::fromConstant
          (Compilation *compilation,Expression *value,ConstantRange range,ASTContext *context)

{
  SourceRange range_00;
  SourceRange range_01;
  SourceRange exprRange;
  DeferredSourceRange sourceRange;
  DeferredSourceRange sourceRange_00;
  SourceRange valueRange;
  bool bVar1;
  Expression *pEVar2;
  long in_RSI;
  Compilation *in_RDI;
  Type *elementType;
  Type *valueType;
  RangeSelectExpression *result;
  Expression *right;
  Expression *left;
  undefined4 uVar3;
  int in_stack_fffffffffffffe6c;
  undefined4 uVar4;
  Compilation *in_stack_fffffffffffffe70;
  SourceLocation compilation_00;
  SVInt *in_stack_fffffffffffffe80;
  Expression *in_stack_fffffffffffffe88;
  Expression *in_stack_fffffffffffffe90;
  Expression *in_stack_fffffffffffffe98;
  SVInt *in_stack_fffffffffffffea8;
  Compilation *value_00;
  Compilation *in_stack_fffffffffffffeb0;
  Compilation *compilation_01;
  Expression **in_stack_fffffffffffffeb8;
  Type *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  ConstantRange in_stack_fffffffffffffef8;
  ASTContext *in_stack_ffffffffffffff00;
  Compilation *in_stack_ffffffffffffff08;
  not_null<const_slang::ast::Type_*> in_stack_ffffffffffffff10;
  SourceLocation in_stack_ffffffffffffff18;
  SourceLocation SVar5;
  PointerIntPair<const_slang::syntax::SyntaxNode_*,_1U,_1U,_bool> in_stack_ffffffffffffff20;
  PointerIntPair<const_slang::syntax::SyntaxNode_*,_1U,_1U,_bool> PVar6;
  SourceLocation in_stack_ffffffffffffff30;
  SourceLocation in_stack_ffffffffffffff38;
  Type *local_b8;
  not_null<const_slang::ast::Type_*> local_b0;
  undefined8 local_a8;
  SourceLocation local_a0;
  undefined8 local_98;
  undefined8 local_90;
  Type *local_88;
  Type *local_80;
  undefined4 local_74;
  RangeSelectExpression *local_70;
  undefined1 local_68 [56];
  Expression *local_30;
  long local_20;
  Compilation *local_18;
  
  local_20 = in_RSI;
  local_18 = in_RDI;
  SVInt::SVInt<int>((SVInt *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
  pEVar2 = IntegerLiteral::fromConstant(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  SVInt::~SVInt(in_stack_fffffffffffffe80);
  local_30 = pEVar2;
  Expression::selfDetermined((ASTContext *)in_RDI,in_stack_fffffffffffffeb8);
  compilation_01 = (Compilation *)local_68;
  value_00 = local_18;
  SVInt::SVInt<int>((SVInt *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
  pEVar2 = IntegerLiteral::fromConstant(compilation_01,(SVInt *)value_00);
  SVInt::~SVInt(in_stack_fffffffffffffe80);
  local_68._16_8_ = pEVar2;
  Expression::selfDetermined((ASTContext *)in_RDI,(Expression **)pEVar2);
  local_74 = 0;
  Compilation::getErrorType(local_18);
  pEVar2 = (Expression *)(local_20 + 0x20);
  local_70 = BumpAllocator::
             emplace<slang::ast::RangeSelectExpression,slang::ast::RangeSelectionKind,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange&>
                       (&compilation_01->super_BumpAllocator,(RangeSelectionKind *)value_00,
                        (Type *)local_18,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                        in_stack_fffffffffffffe88,(SourceRange *)in_RDI);
  bVar1 = Expression::bad((Expression *)in_stack_fffffffffffffe70);
  if (((!bVar1) && (bVar1 = Expression::bad((Expression *)in_stack_fffffffffffffe70), !bVar1)) &&
     (bVar1 = Expression::bad((Expression *)in_stack_fffffffffffffe70), !bVar1)) {
    local_80 = not_null<const_slang::ast::Type_*>::operator*
                         ((not_null<const_slang::ast::Type_*> *)0xbe724b);
    local_98 = *(undefined8 *)(local_20 + 0x20);
    local_90 = *(undefined8 *)(local_20 + 0x28);
    local_a8 = *(undefined8 *)(local_20 + 0x20);
    compilation_00 = *(SourceLocation *)(local_20 + 0x28);
    uVar3 = (undefined4)local_a8;
    uVar4 = (undefined4)((ulong)local_a8 >> 0x20);
    exprRange.endLoc = in_stack_ffffffffffffff18;
    exprRange.startLoc = (SourceLocation)in_stack_ffffffffffffff10.ptr;
    valueRange.endLoc = in_stack_ffffffffffffff38;
    valueRange.startLoc = in_stack_ffffffffffffff30;
    local_a0 = compilation_00;
    local_88 = getIndexedType(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                              (Type *)in_stack_fffffffffffffef8,exprRange,valueRange,
                              (bool)in_stack_fffffffffffffef7);
    bVar1 = Type::isError((Type *)0xbe72f3);
    if (!bVar1) {
      bVar1 = Type::isUnpackedArray((Type *)CONCAT44(uVar4,uVar3));
      if (bVar1) {
        not_null<const_slang::ast::Scope_*>::operator*
                  ((not_null<const_slang::ast::Scope_*> *)0xbe7346);
        SVar5 = (local_70->super_Expression).sourceRange.startLoc;
        PVar6.value = *(uintptr_t *)&(local_70->super_Expression).sourceRange.endLoc;
        range_00.startLoc._4_4_ = uVar4;
        range_00.startLoc._0_4_ = uVar3;
        range_00.endLoc = compilation_00;
        slang::syntax::DeferredSourceRange::DeferredSourceRange
                  ((DeferredSourceRange *)0xbe73a5,range_00);
        sourceRange.range.endLoc = SVar5;
        sourceRange.range.startLoc = (SourceLocation)in_stack_ffffffffffffff10.ptr;
        sourceRange.node.value = PVar6.value;
        local_b8 = FixedSizeUnpackedArrayType::fromDim
                             ((Scope *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0)
                              ,in_stack_fffffffffffffee8,in_stack_fffffffffffffef8,sourceRange);
        not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>(&local_b0,&local_b8);
        (local_70->super_Expression).type.ptr = local_b0.ptr;
      }
      else {
        not_null<const_slang::ast::Scope_*>::operator*
                  ((not_null<const_slang::ast::Scope_*> *)0xbe7420);
        range_01.startLoc._4_4_ = uVar4;
        range_01.startLoc._0_4_ = uVar3;
        range_01.endLoc = compilation_00;
        slang::syntax::DeferredSourceRange::DeferredSourceRange
                  ((DeferredSourceRange *)0xbe7473,range_01);
        sourceRange_00.range.endLoc = in_stack_ffffffffffffff18;
        sourceRange_00.range.startLoc = (SourceLocation)in_stack_ffffffffffffff10.ptr;
        sourceRange_00.node.value = in_stack_ffffffffffffff20.value;
        PackedArrayType::fromDim
                  ((Scope *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                   in_stack_fffffffffffffee8,in_stack_fffffffffffffef8,sourceRange_00);
        not_null<const_slang::ast::Type_*>::not_null<const_slang::ast::Type_*>
                  ((not_null<const_slang::ast::Type_*> *)&stack0xffffffffffffff10,
                   (Type **)&stack0xffffffffffffff08);
        (local_70->super_Expression).type.ptr = in_stack_ffffffffffffff10.ptr;
      }
      return &local_70->super_Expression;
    }
    pEVar2 = Expression::badExpr((Compilation *)compilation_00,(Expression *)CONCAT44(uVar4,uVar3));
    return pEVar2;
  }
  pEVar2 = Expression::badExpr(in_stack_fffffffffffffe70,pEVar2);
  return pEVar2;
}

Assistant:

Expression& RangeSelectExpression::fromConstant(Compilation& compilation, Expression& value,
                                                ConstantRange range, const ASTContext& context) {
    Expression* left = &IntegerLiteral::fromConstant(compilation, range.left);
    selfDetermined(context, left);

    Expression* right = &IntegerLiteral::fromConstant(compilation, range.right);
    selfDetermined(context, right);

    auto result = compilation.emplace<RangeSelectExpression>(RangeSelectionKind::Simple,
                                                             compilation.getErrorType(), value,
                                                             *left, *right, value.sourceRange);
    if (value.bad() || left->bad() || right->bad())
        return badExpr(compilation, result);

    const Type& valueType = *value.type;
    const Type& elementType = getIndexedType(compilation, context, valueType, value.sourceRange,
                                             value.sourceRange, true);

    if (elementType.isError())
        return badExpr(compilation, result);

    // This method is only called on expressions with a fixed range type.
    SLANG_ASSERT(range.isLittleEndian() == valueType.getFixedRange().isLittleEndian());
    SLANG_ASSERT(valueType.hasFixedRange());

    if (valueType.isUnpackedArray()) {
        result->type = &FixedSizeUnpackedArrayType::fromDim(*context.scope, elementType, range,
                                                            result->sourceRange);
    }
    else {
        result->type = &PackedArrayType::fromDim(*context.scope, elementType, range,
                                                 result->sourceRange);
    }

    return *result;
}